

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::JUnitTestCaseData::appendSubcaseNamesToLastTestcase
          (JUnitTestCaseData *this,
          vector<doctest::String,_std::allocator<doctest::String>_> *nameStack)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  *in_RDI;
  String *curr;
  iterator __end3;
  iterator __begin3;
  vector<doctest::String,_std::allocator<doctest::String>_> *__range3;
  allocator *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  reference local_30;
  String *local_28;
  __normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (String *)
       std::vector<doctest::String,_std::allocator<doctest::String>_>::begin
                 ((vector<doctest::String,_std::allocator<doctest::String>_> *)
                  in_stack_ffffffffffffff68);
  local_28 = (String *)
             std::vector<doctest::String,_std::allocator<doctest::String>_>::end
                       ((vector<doctest::String,_std::allocator<doctest::String>_> *)
                        in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                        *)in_RDI,
                       (__normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
               ::operator*(local_20);
    uVar2 = String::size((String *)in_stack_ffffffffffffff68);
    if (uVar2 != 0) {
      in_stack_ffffffffffffff68 = &local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"/",in_stack_ffffffffffffff68);
      String::c_str((String *)in_stack_ffffffffffffff68);
      std::operator+(in_stack_ffffffffffffff78,(char *)in_RDI);
      pvVar3 = std::
               vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
               ::back(in_RDI);
      std::__cxx11::string::operator+=((string *)&pvVar3->name,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    __gnu_cxx::
    __normal_iterator<doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void appendSubcaseNamesToLastTestcase(std::vector<String> nameStack) {
                for(auto& curr: nameStack)
                    if(curr.size())
                        testcases.back().name += std::string("/") + curr.c_str();
            }